

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall tt::Thread::~Thread(Thread *this)

{
  Thread *this_local;
  
  if (((this->m_started & 1U) != 0) && ((this->m_joined & 1U) == 0)) {
    pthread_detach(this->m_pthreadId);
  }
  CountDownLatch::~CountDownLatch(&this->m_latch);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::function<void_()>::~function(&this->m_func);
  return;
}

Assistant:

Thread::~Thread(){
	if(m_started && !m_joined) pthread_detach(m_pthreadId);
}